

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QSize __thiscall QDockAreaLayoutInfo::minimumSize(QDockAreaLayoutInfo *this)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  qsizetype qVar6;
  int *piVar7;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutItem *item;
  int i;
  bool first;
  QSize tbm;
  QSize min_size;
  int b;
  int a;
  QSize result;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff70;
  Orientation o;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_50;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  QSize local_30;
  int local_28;
  int local_24;
  QSize local_20;
  int local_18;
  int local_14;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = isEmpty((QDockAreaLayoutInfo *)0x56c5e0);
  if (bVar3) {
    QSize::QSize((QSize *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                 in_stack_ffffffffffffff68);
    goto LAB_0056c91f;
  }
  local_14 = 0;
  local_18 = 0;
  bVar3 = true;
  for (local_50 = 0;
      qVar6 = QList<QDockAreaLayoutItem>::size((QList<QDockAreaLayoutItem> *)(in_RDI + 8)),
      local_50 < qVar6; local_50 = local_50 + 1) {
    QList<QDockAreaLayoutItem>::at
              ((QList<QDockAreaLayoutItem> *)in_stack_ffffffffffffff70,
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    bVar4 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (!bVar4) {
      local_20 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_20 = QDockAreaLayoutItem::minimumSize
                           ((QDockAreaLayoutItem *)
                            CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      o = (Orientation)((ulong)in_stack_ffffffffffffff70 >> 0x20);
      if ((*(byte *)(in_RDI + 0xb) & 1) == 0) {
        if (!bVar3) {
          local_14 = *(int *)*in_RDI + local_14;
        }
        iVar5 = pick(o,(QSize *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        local_14 = iVar5 + local_14;
      }
      else {
        local_24 = pick(o,(QSize *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        piVar7 = qMax<int>(&local_14,&local_24);
        local_14 = *piVar7;
      }
      local_28 = perp((Orientation)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                      (QSize *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      piVar7 = qMax<int>(&local_18,&local_28);
      local_18 = *piVar7;
      bVar3 = false;
    }
  }
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)in_stack_ffffffffffffff70);
  iVar2 = local_14;
  piVar7 = rpick((Orientation)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                 (QSize *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  iVar5 = local_18;
  *piVar7 = iVar2;
  piVar7 = rperp((Orientation)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                 (QSize *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  *piVar7 = iVar5;
  local_30 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = tabBarMinimumSize(in_stack_ffffffffffffff70);
  bVar3 = QSize::isNull((QSize *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  if (bVar3) goto LAB_0056c91f;
  uVar1 = *(uint *)(in_RDI + 0xd);
  if (uVar1 < 2) {
LAB_0056c841:
    iVar5 = QSize::height((QSize *)0x56c84b);
    piVar7 = QSize::rheight((QSize *)0x56c85c);
    *piVar7 = iVar5 + *piVar7;
    local_34 = QSize::width((QSize *)0x56c86e);
    local_38 = QSize::width((QSize *)0x56c87f);
    piVar7 = qMax<int>(&local_34,&local_38);
    iVar5 = *piVar7;
    piVar7 = QSize::rwidth((QSize *)0x56c8a5);
    *piVar7 = iVar5;
  }
  else {
    if (1 < uVar1 - 2) {
      if (uVar1 - 4 < 2) goto LAB_0056c841;
      if (1 < uVar1 - 6) goto LAB_0056c91f;
    }
    local_3c = QSize::height((QSize *)0x56c8b7);
    local_40 = QSize::height((QSize *)0x56c8c8);
    piVar7 = qMax<int>(&local_3c,&local_40);
    iVar5 = *piVar7;
    piVar7 = QSize::rheight((QSize *)0x56c8ee);
    *piVar7 = iVar5;
    iVar5 = QSize::width((QSize *)0x56c8fe);
    piVar7 = QSize::rwidth((QSize *)0x56c90f);
    *piVar7 = iVar5 + *piVar7;
  }
LAB_0056c91f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QDockAreaLayoutInfo::minimumSize() const
{
    if (isEmpty())
        return QSize(0, 0);

    int a = 0, b = 0;
    bool first = true;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;

        QSize min_size = item.minimumSize();
#if QT_CONFIG(tabbar)
        if (tabbed) {
            a = qMax(a, pick(o, min_size));
        } else
#endif
        {
            if (!first)
                a += *sep;
            a += pick(o, min_size);
        }
        b = qMax(b, perp(o, min_size));

        first = false;
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

#if QT_CONFIG(tabbar)
    QSize tbm = tabBarMinimumSize();
    if (!tbm.isNull()) {
        switch (tabBarShape) {
            case QTabBar::RoundedNorth:
            case QTabBar::RoundedSouth:
            case QTabBar::TriangularNorth:
            case QTabBar::TriangularSouth:
                result.rheight() += tbm.height();
                result.rwidth() = qMax(tbm.width(), result.width());
                break;
            case QTabBar::RoundedEast:
            case QTabBar::RoundedWest:
            case QTabBar::TriangularEast:
            case QTabBar::TriangularWest:
                result.rheight() = qMax(tbm.height(), result.height());
                result.rwidth() += tbm.width();
                break;
            default:
                break;
        }
    }
#endif // QT_CONFIG(tabbar)

    return result;
}